

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O0

void gen_mfsri(DisasContext_conflict10 *ctx)

{
  TCGContext_conflict10 *tcg_ctx_00;
  uint32_t uVar1;
  uint32_t uVar2;
  TCGv_i64 EA;
  TCGv_i64 t0;
  int rd;
  int ra;
  TCGContext_conflict10 *tcg_ctx;
  DisasContext_conflict10 *ctx_local;
  
  tcg_ctx_00 = ctx->uc->tcg_ctx;
  uVar1 = rA(ctx->opcode);
  uVar2 = rD(ctx->opcode);
  if ((ctx->pr & 1U) == 0) {
    EA = tcg_temp_new_i64(tcg_ctx_00);
    gen_addr_reg_index(ctx,EA);
    tcg_gen_extract_i64_ppc64(tcg_ctx_00,EA,EA,0x1c,4);
    gen_helper_load_sr(tcg_ctx_00,cpu_gpr[(int)uVar2],tcg_ctx_00->cpu_env,EA);
    tcg_temp_free_i64(tcg_ctx_00,EA);
    if ((uVar1 != 0) && (uVar1 != uVar2)) {
      tcg_gen_mov_i64_ppc64(tcg_ctx_00,cpu_gpr[(int)uVar1],cpu_gpr[(int)uVar2]);
    }
  }
  else {
    gen_priv_exception(ctx,1);
  }
  return;
}

Assistant:

static void gen_mfsri(DisasContext *ctx)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    int ra = rA(ctx->opcode);
    int rd = rD(ctx->opcode);
    TCGv t0;

    CHK_SV;
    t0 = tcg_temp_new(tcg_ctx);
    gen_addr_reg_index(ctx, t0);
    tcg_gen_extract_tl(tcg_ctx, t0, t0, 28, 4);
    gen_helper_load_sr(tcg_ctx, cpu_gpr[rd], tcg_ctx->cpu_env, t0);
    tcg_temp_free(tcg_ctx, t0);
    if (ra != 0 && ra != rd) {
        tcg_gen_mov_tl(tcg_ctx, cpu_gpr[ra], cpu_gpr[rd]);
    }
}